

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

bool SearchHelper(ON_RTreeNode *a_node,ON_RTreeSphere *a_sphere,
                 ON_RTreeSearchResultCallback *a_result)

{
  double dVar1;
  uint uVar2;
  double dVar3;
  bool bVar4;
  double *pdVar5;
  ulong uVar6;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double r [6];
  double adStack_68 [7];
  
  uVar2 = a_node->m_count;
  uVar8 = (ulong)(int)uVar2;
  if ((long)uVar8 < 1) {
    return true;
  }
  dVar1 = a_sphere->m_radius;
  pdVar5 = a_node->m_branch[0].m_rect.m_max + 2;
  uVar6 = 0xffffffff;
  uVar9 = 0;
  dVar3 = dVar1;
  do {
    dVar13 = a_sphere->m_point[0];
    if (((ON_RTreeBBox *)(pdVar5 + -5))->m_min[0] <= dVar13) {
      dVar10 = 0.0;
      if (pdVar5[-2] < dVar13) {
        dVar10 = dVar13 - pdVar5[-2];
        goto joined_r0x005b0b0d;
      }
LAB_005b0b13:
      dVar14 = a_sphere->m_point[1];
      dVar12 = dVar10;
      if (pdVar5[-4] <= dVar14) {
        dVar13 = 0.0;
        if (pdVar5[-1] < dVar14) {
          dVar13 = dVar14 - pdVar5[-1];
          if (dVar1 < dVar13) goto LAB_005b0c46;
          dVar14 = dVar13;
          if (dVar10 < dVar13) goto LAB_005b0b7e;
        }
LAB_005b0b7a:
        dVar12 = dVar13;
        dVar14 = dVar10;
      }
      else {
        dVar13 = pdVar5[-4] - dVar14;
        if (dVar1 < dVar13) goto LAB_005b0c46;
        dVar14 = dVar13;
        if (dVar13 <= dVar10) goto LAB_005b0b7a;
      }
LAB_005b0b7e:
      dVar10 = a_sphere->m_point[2];
      dVar11 = dVar14;
      if (pdVar5[-3] <= dVar10) {
        dVar13 = 0.0;
        if (*pdVar5 < dVar10) {
          dVar13 = dVar10 - *pdVar5;
          if (dVar1 < dVar13) goto LAB_005b0c46;
          if (dVar14 < dVar13) goto LAB_005b0be3;
        }
LAB_005b0bdf:
        dVar11 = dVar13;
        dVar13 = dVar14;
      }
      else {
        dVar13 = pdVar5[-3] - dVar10;
        if (dVar1 < dVar13) goto LAB_005b0c46;
        if (dVar13 <= dVar14) goto LAB_005b0bdf;
      }
LAB_005b0be3:
      if (0.0 < dVar13) {
        dVar10 = (dVar11 / dVar13) * (dVar11 / dVar13) + (dVar12 / dVar13) * (dVar12 / dVar13) + 1.0
        ;
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        dVar13 = dVar13 * dVar10;
      }
    }
    else {
      dVar10 = ((ON_RTreeBBox *)(pdVar5 + -5))->m_min[0] - dVar13;
joined_r0x005b0b0d:
      dVar13 = dVar10;
      if (dVar10 <= dVar1) goto LAB_005b0b13;
    }
LAB_005b0c46:
    adStack_68[uVar9] = dVar13;
    if (dVar13 <= dVar3) {
      uVar6 = uVar9 & 0xffffffff;
    }
    dVar3 = (double)((ulong)dVar3 & -(ulong)(dVar3 < dVar13) |
                    ~-(ulong)(dVar3 < dVar13) & (ulong)dVar13);
    uVar9 = uVar9 + 1;
    pdVar5 = pdVar5 + 7;
    if (uVar8 == uVar9) {
      if (-1 < (int)uVar6) {
        if (a_node->m_level < 1) {
          bVar4 = (*a_result->m_resultCallback)
                            (a_result->m_context,
                             (ON__INT_PTR)a_node->m_branch[uVar6].field_1.m_child);
          if (!bVar4) {
            return false;
          }
          paVar7 = &a_node->m_branch[0].field_1;
          uVar9 = 0;
          do {
            if (((uVar6 != uVar9) && (adStack_68[uVar9] <= a_sphere->m_radius)) &&
               (bVar4 = (*a_result->m_resultCallback)
                                  (a_result->m_context,(ON__INT_PTR)paVar7->m_child), !bVar4)) {
              return false;
            }
            uVar9 = uVar9 + 1;
            paVar7 = paVar7 + 7;
          } while (uVar8 != uVar9);
        }
        else {
          bVar4 = SearchHelper(a_node->m_branch[uVar6].field_1.m_child,a_sphere,a_result);
          if (!bVar4) {
            return false;
          }
          paVar7 = &a_node->m_branch[0].field_1;
          uVar8 = 0;
          do {
            if (((uVar6 != uVar8) && (adStack_68[uVar8] <= a_sphere->m_radius)) &&
               (bVar4 = SearchHelper(paVar7->m_child,a_sphere,a_result), !bVar4)) {
              return false;
            }
            uVar8 = uVar8 + 1;
            paVar7 = paVar7 + 7;
          } while (uVar2 != uVar8);
        }
      }
      return true;
    }
  } while( true );
}

Assistant:

static
bool SearchHelper(const ON_RTreeNode* a_node, struct ON_RTreeSphere* a_sphere, ON_RTreeSearchResultCallback& a_result ) 
{
  // NOTE: 
  //  Some versions of ON_RTree::Search shrink a_sphere as the search progresses.
  int i, closest_i, count;
  const double* sphere_center;
  const ON_RTreeBranch* branch;
  double r[ON_RTree_MAX_NODE_COUNT], sphere_radius, closest_d;
  
  if ( (count = a_node->m_count) > 0 )
  {
    branch = a_node->m_branch;
    sphere_center = a_sphere->m_point;
    sphere_radius = a_sphere->m_radius;
    closest_i = -1;
    closest_d = sphere_radius;

    for( i = 0; i < count; ++i )
    {
      // The radius parameter passed to DistanceToBoxHelper()
      // needs to be sphere_radius and not closest_d in order 
      // for the for() loops below to work correctly.
      r[i] = DistanceToBoxHelper( sphere_center, sphere_radius, &branch[i].m_rect );
      if ( r[i] <= closest_d )
      {
        closest_d = r[i];
        closest_i = i;
      }
    }

    // If all of the branches rectangles do not intersect the sphere,
    // then closest_i = -1.
    if ( closest_i >= 0 )
    {
      if(a_node->IsInternalNode()) 
      {
        // a_node is an internal node - search m_branch[].m_child as needed.
        // Search a closer node first to avoid worst case search times
        // in calculations where the calls to a_result.m_resultCallback()
        // reduce a_sphere->m_radius as results are found.  Closest point
        // calculations are an example.
        if ( !SearchHelper(branch[closest_i].m_child, a_sphere, a_result) )
        {
          // callback canceled search
          return false;
        }

        for( i = 0; i < count; ++i )
        {
          // Note that the calls to SearchHelper() can reduce the
          // value of a_sphere->m_radius.
          if( i != closest_i && r[i] <= a_sphere->m_radius )
          {
            if(!SearchHelper(branch[i].m_child, a_sphere, a_result) )
            {
              return false; // Don't continue searching
            }
          }
        }
      }
      else
      {
        // a_node is a leaf node - return m_branch[].m_id values
        // Search a closer node first to avoid worst case search times
        // in calculations where the calls to a_result.m_resultCallback()
        // reduce a_sphere->m_radius as results are found.  Closest point
        // calculations are an example.
        if ( !a_result.m_resultCallback( a_result.m_context, branch[closest_i].m_id ) ) 
        {
          // callback canceled search
          return false;
        }

        for( i = 0; i < count; ++i)
        {
          // Note that the calls to a_result.m_resultCallback() can reduce
          // the value of a_sphere->m_radius.
          if( i != closest_i && r[i] <= a_sphere->m_radius )
          {
            if ( !a_result.m_resultCallback( a_result.m_context, branch[i].m_id ) )
            {
              // callback canceled search
              return false;
            }
          }
        }
      }
    }
  }

  return true; // Continue searching
}